

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluUtil.cpp
# Opt level: O0

EGLDisplay eglu::getDisplay(NativeDisplay *nativeDisplay)

{
  int iVar1;
  Capability CVar2;
  deBool dVar3;
  EGLenum EVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  InternalError *pIVar6;
  char *__s;
  undefined4 extraout_var_00;
  const_reference pvVar7;
  TestError *pTVar8;
  Library *egl_00;
  bool bVar9;
  bool bVar10;
  bool local_f2;
  undefined1 local_d8 [8];
  vector<int,_std::allocator<int>_> legacyAttribs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_98;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_90;
  allocator<char> local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_58;
  undefined1 local_50 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  platformExts;
  EGLDisplay local_28;
  EGLDisplay display;
  bool usePlatformExt;
  bool supportsPlatformGetDisplay;
  bool supportsLegacyGetDisplay;
  Library *egl;
  NativeDisplay *nativeDisplay_local;
  eglu *this;
  
  iVar1 = (*nativeDisplay->_vptr_NativeDisplay[2])();
  this = (eglu *)CONCAT44(extraout_var,iVar1);
  CVar2 = NativeDisplay::getCapabilities(nativeDisplay);
  bVar9 = (CVar2 & CAPABILITY_GET_DISPLAY_LEGACY) == 0;
  CVar2 = NativeDisplay::getCapabilities(nativeDisplay);
  bVar10 = (CVar2 & CAPABILITY_GET_DISPLAY_PLATFORM) != 0;
  display._5_1_ = false;
  while ((dVar3 = ::deGetFalse(), dVar3 == 0 && ((!bVar9 || (bVar10))))) {
    dVar3 = ::deGetFalse();
    if (dVar3 == 0) {
      if (bVar10) {
        getClientExtensions_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_50,this,egl_00);
        local_58._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_50);
        local_60._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_50);
        std::allocator<char>::allocator();
        legacyAttribs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._6_1_ = 0;
        legacyAttribs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._5_1_ = 0;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_80,"EGL_EXT_platform_base",&local_81);
        bVar10 = de::
                 contains<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                           (&local_58,&local_60,&local_80);
        local_f2 = false;
        if (bVar10) {
          local_90._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_50);
          local_98._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_50);
          __s = NativeDisplay::getPlatformExtensionName(nativeDisplay);
          std::allocator<char>::allocator();
          legacyAttribs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b8,__s,
                     (allocator<char> *)
                     ((long)&legacyAttribs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage + 7));
          legacyAttribs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._5_1_ = 1;
          local_f2 = de::
                     contains<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                               (&local_90,&local_98,&local_b8);
        }
        display._5_1_ = local_f2;
        if ((legacyAttribs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._5_1_ & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_b8);
        }
        if ((legacyAttribs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._6_1_ & 1) != 0) {
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&legacyAttribs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage + 7));
        }
        std::__cxx11::string::~string((string *)&local_80);
        std::allocator<char>::~allocator(&local_81);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_50);
      }
      if (display._5_1_ == false) {
        if (bVar9) {
          pIVar6 = (InternalError *)__cxa_allocate_exception(0x38);
          tcu::InternalError::InternalError
                    (pIVar6,"No supported way to get EGL display",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluUtil.cpp"
                     ,0x103);
          __cxa_throw(pIVar6,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
        }
        iVar1 = (*nativeDisplay->_vptr_NativeDisplay[3])();
        local_28 = (EGLDisplay)(**(code **)(*(long *)this + 0xf0))(this,iVar1);
        dVar5 = (**(code **)(*(long *)this + 0xf8))();
        checkError(dVar5,"eglGetDisplay()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluUtil.cpp"
                   ,0xff);
        do {
          dVar3 = ::deGetFalse();
          if ((dVar3 != 0) || (local_28 == (EGLDisplay)0x0)) {
            pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar8,(char *)0x0,"display != EGL_NO_DISPLAY",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluUtil.cpp"
                       ,0x100);
            __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
          }
          dVar3 = ::deGetFalse();
        } while (dVar3 != 0);
      }
      else {
        iVar1 = (*nativeDisplay->_vptr_NativeDisplay[5])();
        toLegacyAttribList((vector<int,_std::allocator<int>_> *)local_d8,
                           (EGLAttrib *)CONCAT44(extraout_var_00,iVar1));
        EVar4 = NativeDisplay::getPlatformType(nativeDisplay);
        iVar1 = (*nativeDisplay->_vptr_NativeDisplay[4])();
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_d8,0);
        local_28 = (EGLDisplay)(**(code **)(*(long *)this + 0x108))(this,EVar4,iVar1,pvVar7);
        dVar5 = (**(code **)(*(long *)this + 0xf8))();
        checkError(dVar5,"eglGetPlatformDisplayEXT()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluUtil.cpp"
                   ,0xf9);
        do {
          dVar3 = ::deGetFalse();
          if ((dVar3 != 0) || (local_28 == (EGLDisplay)0x0)) {
            pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar8,(char *)0x0,"display != EGL_NO_DISPLAY",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluUtil.cpp"
                       ,0xfa);
            __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
          }
          dVar3 = ::deGetFalse();
        } while (dVar3 != 0);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)local_d8);
      }
      return local_28;
    }
  }
  pIVar6 = (InternalError *)__cxa_allocate_exception(0x38);
  tcu::InternalError::InternalError
            (pIVar6,(char *)0x0,"supportsLegacyGetDisplay || supportsPlatformGetDisplay",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluUtil.cpp"
             ,0xeb);
  __cxa_throw(pIVar6,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
}

Assistant:

EGLDisplay getDisplay (NativeDisplay& nativeDisplay)
{
	const Library&	egl								= nativeDisplay.getLibrary();
	const bool		supportsLegacyGetDisplay		= (nativeDisplay.getCapabilities() & NativeDisplay::CAPABILITY_GET_DISPLAY_LEGACY) != 0;
	const bool		supportsPlatformGetDisplay		= (nativeDisplay.getCapabilities() & NativeDisplay::CAPABILITY_GET_DISPLAY_PLATFORM) != 0;
	bool			usePlatformExt					= false;
	EGLDisplay		display							= EGL_NO_DISPLAY;

	TCU_CHECK_INTERNAL(supportsLegacyGetDisplay || supportsPlatformGetDisplay);

	if (supportsPlatformGetDisplay)
	{
		const vector<string> platformExts = getClientExtensions(egl);
		usePlatformExt = de::contains(platformExts.begin(), platformExts.end(), string("EGL_EXT_platform_base")) &&
						 de::contains(platformExts.begin(), platformExts.end(), string(nativeDisplay.getPlatformExtensionName()));
	}

	if (usePlatformExt)
	{
		const vector<EGLint>	legacyAttribs	= toLegacyAttribList(nativeDisplay.getPlatformAttributes());

		display = egl.getPlatformDisplayEXT(nativeDisplay.getPlatformType(), nativeDisplay.getPlatformNative(), &legacyAttribs[0]);
		EGLU_CHECK_MSG(egl, "eglGetPlatformDisplayEXT()");
		TCU_CHECK(display != EGL_NO_DISPLAY);
	}
	else if (supportsLegacyGetDisplay)
	{
		display = egl.getDisplay(nativeDisplay.getLegacyNative());
		EGLU_CHECK_MSG(egl, "eglGetDisplay()");
		TCU_CHECK(display != EGL_NO_DISPLAY);
	}
	else
		throw tcu::InternalError("No supported way to get EGL display", DE_NULL, __FILE__, __LINE__);

	DE_ASSERT(display != EGL_NO_DISPLAY);
	return display;
}